

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCacheCommand.cxx
# Opt level: O2

void __thiscall cmLoadCacheCommand::CheckLine(cmLoadCacheCommand *this,char *line)

{
  cmMakefile *this_00;
  bool bVar1;
  iterator iVar2;
  CacheEntryType type;
  string var;
  string value;
  allocator local_7d;
  CacheEntryType local_7c;
  string local_78;
  string local_58;
  string local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_38.field_2._M_local_buf[0] = '\0';
  local_7c = UNINITIALIZED;
  std::__cxx11::string::string((string *)&local_58,line,&local_7d);
  bVar1 = cmake::ParseCacheEntry(&local_58,&local_78,&local_38,&local_7c);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->VariablesToRead)._M_t,&local_78);
    if ((_Rb_tree_header *)iVar2._M_node !=
        &(this->VariablesToRead)._M_t._M_impl.super__Rb_tree_header) {
      std::operator+(&local_58,&this->Prefix,&local_78);
      std::__cxx11::string::operator=((string *)&local_78,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      this_00 = (this->super_cmCommand).Makefile;
      if (local_38._M_string_length == 0) {
        cmMakefile::RemoveDefinition(this_00,&local_78);
      }
      else {
        cmMakefile::AddDefinition(this_00,&local_78,local_38._M_dataplus._M_p);
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void cmLoadCacheCommand::CheckLine(const char* line)
{
  // Check one line of the cache file.
  std::string var;
  std::string value;
  cmState::CacheEntryType type = cmState::UNINITIALIZED;
  if(cmake::ParseCacheEntry(line, var, value, type))
    {
    // Found a real entry.  See if this one was requested.
    if(this->VariablesToRead.find(var) != this->VariablesToRead.end())
      {
      // This was requested.  Set this variable locally with the given
      // prefix.
      var = this->Prefix + var;
      if(!value.empty())
        {
        this->Makefile->AddDefinition(var, value.c_str());
        }
      else
        {
        this->Makefile->RemoveDefinition(var);
        }
      }
    }
}